

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

Value * DumpResourceGroupsToJsonArray
                  (Value *__return_storage_ptr__,
                  vector<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
                  *resourceGroups)

{
  ptrdiff_t this;
  bool bVar1;
  Value *pVVar2;
  Value local_138;
  Value local_110;
  undefined1 local_e8 [8];
  Value res;
  cmCTestTestResourceRequirement *it2;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
  *__range2;
  Value requirements;
  undefined1 local_68 [8];
  Value jsonResourceGroup;
  vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
  *it;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
  *__range1;
  vector<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
  *resourceGroups_local;
  Value *jsonResourceGroups;
  
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  __end1 = std::
           vector<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
           ::begin(resourceGroups);
  it = (vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
        *)std::
          vector<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
          ::end(resourceGroups);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_*,_std::vector<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>_>
                                     *)&it), bVar1) {
    jsonResourceGroup.limit_ =
         (ptrdiff_t)
         __gnu_cxx::
         __normal_iterator<const_std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_*,_std::vector<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>_>
         ::operator*(&__end1);
    Json::Value::Value((Value *)local_68,objectValue);
    Json::Value::Value((Value *)&__range2,arrayValue);
    this = jsonResourceGroup.limit_;
    __end2 = std::
             vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
             ::begin((vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
                      *)jsonResourceGroup.limit_);
    it2 = (cmCTestTestResourceRequirement *)
          std::
          vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
          ::end((vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
                 *)this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cmCTestTestHandler::cmCTestTestResourceRequirement_*,_std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>
                                       *)&it2), bVar1) {
      res.limit_ = (ptrdiff_t)
                   __gnu_cxx::
                   __normal_iterator<const_cmCTestTestHandler::cmCTestTestResourceRequirement_*,_std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>
                   ::operator*(&__end2);
      Json::Value::Value((Value *)local_e8,objectValue);
      Json::Value::Value(&local_110,(String *)res.limit_);
      pVVar2 = Json::Value::operator[]((Value *)local_e8,".type");
      Json::Value::operator=(pVVar2,&local_110);
      Json::Value::~Value(&local_110);
      Json::Value::Value(&local_138,*(Int *)(res.limit_ + 0x20));
      pVVar2 = Json::Value::operator[]((Value *)local_e8,"slots");
      Json::Value::operator=(pVVar2,&local_138);
      Json::Value::~Value(&local_138);
      Json::Value::append((Value *)&__range2,(Value *)local_e8);
      Json::Value::~Value((Value *)local_e8);
      __gnu_cxx::
      __normal_iterator<const_cmCTestTestHandler::cmCTestTestResourceRequirement_*,_std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>
      ::operator++(&__end2);
    }
    pVVar2 = Json::Value::operator[]((Value *)local_68,"requirements");
    Json::Value::operator=(pVVar2,(Value *)&__range2);
    Json::Value::append(__return_storage_ptr__,(Value *)local_68);
    Json::Value::~Value((Value *)&__range2);
    Json::Value::~Value((Value *)local_68);
    __gnu_cxx::
    __normal_iterator<const_std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_*,_std::vector<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

static Json::Value DumpResourceGroupsToJsonArray(
  const std::vector<
    std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement>>&
    resourceGroups)
{
  Json::Value jsonResourceGroups = Json::arrayValue;
  for (auto const& it : resourceGroups) {
    Json::Value jsonResourceGroup = Json::objectValue;
    Json::Value requirements = Json::arrayValue;
    for (auto const& it2 : it) {
      Json::Value res = Json::objectValue;
      res[".type"] = it2.ResourceType;
      // res[".units"] = it2.UnitsNeeded; // Intentionally commented out
      res["slots"] = it2.SlotsNeeded;
      requirements.append(res);
    }
    jsonResourceGroup["requirements"] = requirements;
    jsonResourceGroups.append(jsonResourceGroup);
  }
  return jsonResourceGroups;
}